

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O0

bool __thiscall ObjectFile::startTransaction(ObjectFile *this,Access param_2)

{
  bool bVar1;
  void *pvVar2;
  undefined8 uVar3;
  long in_RDI;
  File *unaff_retaddr;
  MutexLocker lock;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  MutexLocker *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar4;
  string local_60 [52];
  undefined4 local_2c;
  long lVar5;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar6;
  
  lVar5 = in_RDI;
  MutexLocker::MutexLocker
            (in_stack_ffffffffffffff70,
             (Mutex *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if ((*(byte *)(in_RDI + 0x80) & 1) == 0) {
    pvVar2 = operator_new(0x38);
    std::__cxx11::string::string(local_60,(string *)(in_RDI + 0x90));
    File::File(unaff_retaddr,(string *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
               ,(int)((ulong)lVar5 >> 0x20),SUB81((ulong)lVar5 >> 0x18,0),
               SUB81((ulong)lVar5 >> 0x10,0),SUB81((ulong)lVar5 >> 8,0),SUB81(lVar5,0));
    uVar4 = 0;
    *(void **)(in_RDI + 0x88) = pvVar2;
    std::__cxx11::string::~string(local_60);
    bVar1 = File::isValid(*(File **)(in_RDI + 0x88));
    if ((bVar1) &&
       (bVar1 = File::lock((File *)CONCAT17(uVar4,in_stack_ffffffffffffff98),
                           SUB81((ulong)in_RDI >> 0x38,0)), bVar1)) {
      *(undefined1 *)(in_RDI + 0x80) = 1;
      bVar6 = 1;
    }
    else {
      if (*(long **)(in_RDI + 0x88) != (long *)0x0) {
        (**(code **)(**(long **)(in_RDI + 0x88) + 8))();
      }
      *(undefined8 *)(in_RDI + 0x88) = 0;
      uVar3 = std::__cxx11::string::c_str();
      softHSMLog(3,"startTransaction",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                 ,0x310,"Failed to lock file %s for attribute transaction",uVar3);
      bVar6 = 0;
    }
  }
  else {
    bVar6 = 0;
  }
  local_2c = 1;
  MutexLocker::~MutexLocker(in_stack_ffffffffffffff70);
  return (bool)(bVar6 & 1);
}

Assistant:

bool ObjectFile::startTransaction(Access)
{
	MutexLocker lock(objectMutex);

	if (inTransaction)
	{
		return false;
	}

	transactionLockFile = new File(lockpath, umask, false, true, true);

	if (!transactionLockFile->isValid() || !transactionLockFile->lock())
	{
		delete transactionLockFile;
		transactionLockFile = NULL;

		ERROR_MSG("Failed to lock file %s for attribute transaction", lockpath.c_str());

		return false;
	}

	inTransaction = true;

	return true;
}